

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O2

uint ON_IsRhinoApplicationId(ON_UUID id)

{
  bool bVar1;
  uint uVar2;
  ON_UUID id_local;
  
  id_local.Data4 = id.Data4;
  id_local._0_8_ = id._0_8_;
  bVar1 = operator==(&ON_rhino2_id,&id_local);
  if (bVar1) {
    uVar2 = 2;
  }
  else {
    bVar1 = operator==(&ON_rhino3_id,&id_local);
    if (bVar1) {
      uVar2 = 3;
    }
    else {
      bVar1 = operator==(&ON_rhino4_id,&id_local);
      if (bVar1) {
        uVar2 = 4;
      }
      else {
        bVar1 = operator==(&ON_rhino5_id,&id_local);
        if (bVar1) {
          uVar2 = 5;
        }
        else {
          bVar1 = operator==(&ON_rhino6_id,&id_local);
          if (bVar1) {
            uVar2 = 6;
          }
          else {
            bVar1 = operator==(&ON_rhino7_id,&id_local);
            if (bVar1) {
              uVar2 = 7;
            }
            else {
              bVar1 = operator==(&ON_rhino8_id,&id_local);
              uVar2 = (uint)bVar1 << 3;
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

unsigned int ON_IsRhinoApplicationId(
  ON_UUID id
  )
{
  if (ON_rhino2_id == id)
    return 2;
  if (ON_rhino3_id == id)
    return 3;
  if (ON_rhino4_id == id)
    return 4;
  if (ON_rhino5_id == id)
    return 5;
  if (ON_rhino6_id == id)
    return 6;
  if (ON_rhino7_id == id)
    return 7;
  if (ON_rhino8_id == id)
    return 8;
  return 0;
}